

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaLf.c
# Opt level: O0

int Lf_SetLastCutContainsArea(Lf_Cut_t **pCuts,int nCuts)

{
  Lf_Cut_t *pLVar1;
  bool bVar2;
  int iVar3;
  Lf_Cut_t *t;
  int fChanges;
  int k;
  int i;
  int nCuts_local;
  Lf_Cut_t **pCuts_local;
  
  bVar2 = false;
  for (fChanges = 1; fChanges < nCuts; fChanges = fChanges + 1) {
    if (((*(uint *)&pCuts[nCuts]->field_0x14 >> 0x18 < *(uint *)&pCuts[fChanges]->field_0x14 >> 0x18
         ) && ((pCuts[nCuts]->Sign & pCuts[fChanges]->Sign) == pCuts[nCuts]->Sign)) &&
       (iVar3 = Lf_SetCutIsContainedOrder(pCuts[fChanges],pCuts[nCuts]), iVar3 != 0)) {
      *(uint *)&pCuts[fChanges]->field_0x14 =
           *(uint *)&pCuts[fChanges]->field_0x14 & 0xffffff | 0xff000000;
      bVar2 = true;
    }
  }
  pCuts_local._4_4_ = nCuts;
  if (bVar2) {
    t._4_4_ = 1;
    for (fChanges = 1; fChanges <= nCuts; fChanges = fChanges + 1) {
      if (*(uint *)&pCuts[fChanges]->field_0x14 >> 0x18 != 0xff) {
        if (t._4_4_ < fChanges) {
          pLVar1 = pCuts[t._4_4_];
          pCuts[t._4_4_] = pCuts[fChanges];
          pCuts[fChanges] = pLVar1;
        }
        t._4_4_ = t._4_4_ + 1;
      }
    }
    pCuts_local._4_4_ = t._4_4_ + -1;
  }
  return pCuts_local._4_4_;
}

Assistant:

static inline int Lf_SetLastCutContainsArea( Lf_Cut_t ** pCuts, int nCuts )
{
    int i, k, fChanges = 0;
    for ( i = 1; i < nCuts; i++ )
        if ( pCuts[nCuts]->nLeaves < pCuts[i]->nLeaves && (pCuts[nCuts]->Sign & pCuts[i]->Sign) == pCuts[nCuts]->Sign && Lf_SetCutIsContainedOrder(pCuts[i], pCuts[nCuts]) )
            pCuts[i]->nLeaves = LF_NO_LEAF, fChanges = 1;
    if ( !fChanges )
        return nCuts;
    for ( i = k = 1; i <= nCuts; i++ )
    {
        if ( pCuts[i]->nLeaves == LF_NO_LEAF )
            continue;
        if ( k < i )
            ABC_SWAP( Lf_Cut_t *, pCuts[k], pCuts[i] );
        k++;
    }
    return k - 1;
}